

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_sign_deterministic
              (uint8_t *private_key,uint8_t *message_hash,uint hash_size,
              uECC_HashContext *hash_context,uint8_t *signature,uECC_Curve curve)

{
  short sVar1;
  uint uVar2;
  uint8_t *K;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint8_t *V;
  long lVar9;
  long lVar10;
  wordcount_t T_bytes;
  char cVar11;
  uint8_t auStack_d8 [128];
  uECC_word_t T [4];
  
  K = hash_context->tmp;
  uVar8 = (ulong)hash_context->result_size;
  V = K + uVar8;
  cVar11 = curve->num_bytes;
  sVar1 = curve->num_n_bits;
  for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + 1) {
    V[uVar6] = '\x01';
    K[uVar6] = '\0';
    uVar8 = (ulong)hash_context->result_size;
  }
  iVar3 = (sVar1 + 0x3f) / 0x40;
  HMAC_init(hash_context,K);
  V[hash_context->result_size] = '\0';
  (*hash_context->update_hash)(hash_context,V,hash_context->result_size + 1);
  (*hash_context->update_hash)(hash_context,private_key,(int)cVar11);
  (*hash_context->update_hash)(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K,K);
  update_V(hash_context,K,V);
  HMAC_init(hash_context,K);
  V[hash_context->result_size] = '\x01';
  (*hash_context->update_hash)(hash_context,V,hash_context->result_size + 1);
  (*hash_context->update_hash)(hash_context,private_key,(int)cVar11);
  (*hash_context->update_hash)(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K,K);
  update_V(hash_context,K,V);
  iVar5 = iVar3 << 0x18;
  lVar9 = 0;
LAB_001088f8:
  if (lVar9 == 0x40) {
    return 0;
  }
  cVar11 = '\0';
  do {
    update_V(hash_context,K,V);
    uVar2 = hash_context->result_size;
    lVar7 = 1;
    while (lVar7 - (ulong)uVar2 != 1) {
      lVar10 = (long)cVar11;
      cVar11 = cVar11 + '\x01';
      *(uint8_t *)((long)T + lVar10) = V[lVar7 + -1];
      lVar7 = lVar7 + 1;
      if (iVar5 >> 0x15 <= (int)cVar11) {
        if ((int)sVar1 < iVar5 >> 0x12) {
          T[(char)iVar3 + -1] = T[(char)iVar3 + -1] & 0xffffffffffffffffU >> (-(char)sVar1 & 0x3fU);
        }
        iVar4 = uECC_sign_with_k(private_key,message_hash,hash_size,T,signature,curve);
        if (iVar4 != 0) {
          return 1;
        }
        HMAC_init(hash_context,K);
        V[hash_context->result_size] = '\0';
        (*hash_context->update_hash)(hash_context,V,hash_context->result_size + 1);
        HMAC_finish(hash_context,K,K);
        update_V(hash_context,K,V);
        lVar9 = lVar9 + 1;
        goto LAB_001088f8;
      }
    }
  } while( true );
}

Assistant:

int uECC_sign_deterministic(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            const uECC_HashContext *hash_context,
                            uint8_t *signature,
                            uECC_Curve curve) {
    uint8_t *K = hash_context->tmp;
    uint8_t *V = K + hash_context->result_size;
    wordcount_t num_bytes = curve->num_bytes;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t tries;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i) {
        V[i] = 0x01;
        K[i] = 0;
    }

    /* K = HMAC_K(V || 0x00 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x00;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    /* K = HMAC_K(V || 0x01 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x01;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        uECC_word_t T[uECC_MAX_WORDS];
        uint8_t *T_ptr = (uint8_t *)T;
        wordcount_t T_bytes = 0;
        for (;;) {
            update_V(hash_context, K, V);
            for (i = 0; i < hash_context->result_size; ++i) {
                T_ptr[T_bytes++] = V[i];
                if (T_bytes >= num_n_words * uECC_WORD_SIZE) {
                    goto filled;
                }
            }
        }
    filled:
        if ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8 > num_n_bits) {
            uECC_word_t mask = (uECC_word_t)-1;
            T[num_n_words - 1] &=
                mask >> ((bitcount_t)(num_n_words * uECC_WORD_SIZE * 8 - num_n_bits));
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, T, signature, curve)) {
            return 1;
        }

        /* K = HMAC_K(V || 0x00) */
        HMAC_init(hash_context, K);
        V[hash_context->result_size] = 0x00;
        HMAC_update(hash_context, V, hash_context->result_size + 1);
        HMAC_finish(hash_context, K, K);

        update_V(hash_context, K, V);
    }
    return 0;
}